

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::SliderBehaviorT<float,float,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,float *v,float v_min,float v_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImGuiContext *pIVar1;
  int iVar2;
  float *pfVar3;
  uint uVar4;
  bool bVar5;
  ulong idx;
  bool bVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ImVec2 IVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  pIVar1 = GImGui;
  idx = (ulong)(flags & 1);
  uVar4 = data_type & 0xfffffffe;
  bVar6 = uVar4 == 8;
  bVar5 = power != 1.0;
  fVar8 = ImVec2::operator[](&bb->Max,idx);
  fVar9 = ImVec2::operator[](&bb->Min,idx);
  fVar16 = (fVar8 - fVar9) + -4.0;
  fVar8 = (pIVar1->Style).GrabMinSize;
  fVar9 = v_max - v_min;
  fVar17 = (float)(~-(uint)(v_min < v_max) & (uint)(v_min - v_max) |
                  -(uint)(v_min < v_max) & (uint)fVar9);
  if ((uVar4 != 8) && (0.0 <= fVar17)) {
    fVar15 = fVar16 / (fVar17 + 1.0);
    uVar7 = -(uint)(fVar8 <= fVar15);
    fVar8 = (float)(~uVar7 & (uint)fVar8 | (uint)fVar15 & uVar7);
  }
  if (fVar16 <= fVar8) {
    fVar8 = fVar16;
  }
  fVar15 = ImVec2::operator[](&bb->Min,idx);
  fVar10 = ImVec2::operator[](&bb->Max,idx);
  if ((!bVar5 || !bVar6) || 0.0 <= v_min * v_max) {
    fVar11 = (float)(-(uint)(v_min < 0.0) & 0x3f800000);
  }
  else {
    uVar7 = -(uint)(-v_min <= v_min);
    fVar11 = powf((float)(uVar7 & (uint)v_min | ~uVar7 & (uint)-v_min),1.0 / power);
    uVar7 = -(uint)(-v_max <= v_max);
    fVar12 = powf((float)(uVar7 & (uint)v_max | ~uVar7 & (uint)-v_max),1.0 / power);
    fVar11 = fVar11 / (fVar12 + fVar11);
  }
  fVar15 = fVar15 + 2.0 + fVar8 * 0.5;
  if (pIVar1->ActiveId != id) {
LAB_00145b76:
    bVar5 = false;
    goto LAB_00145b79;
  }
  if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
    IVar14 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
    fVar12 = IVar14.x;
    if (idx != 0) {
      fVar12 = -IVar14.y;
    }
    if ((pIVar1->NavActivatePressedId == id) && (pIVar1->ActiveIdIsJustActivated == false)) {
      ClearActiveID();
    }
    else if ((fVar12 != 0.0) || (NAN(fVar12))) {
      fVar13 = SliderCalcRatioFromValueT<float,float>(data_type,*v,v_min,v_max,power,fVar11);
      if ((uVar4 != 8) ||
         (iVar2 = ImParseFormatPrecision(format,3), (bool)(~(bVar5 && bVar6) & iVar2 < 1))) {
        if ((ABS(fVar17) <= 100.0) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
          fVar12 = *(float *)(&DAT_0014e7b8 + (ulong)(fVar12 < 0.0) * 4) / fVar17;
        }
        else {
          fVar12 = fVar12 / 100.0;
        }
      }
      else {
        fVar12 = fVar12 / 100.0;
        if (0.0 < (GImGui->IO).NavInputs[0xe]) {
          fVar12 = fVar12 / 10.0;
        }
      }
      uVar7 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
      fVar17 = (float)(~uVar7 & (uint)fVar12 | (uint)(fVar12 * 10.0) & uVar7);
      if ((1.0 <= fVar13) && (0.0 < fVar17)) {
        bVar5 = false;
        goto LAB_00145b79;
      }
      if ((fVar13 <= 0.0) && (fVar17 < 0.0)) goto LAB_00145b76;
      fVar13 = fVar13 + fVar17;
      fVar17 = 1.0;
      if (fVar13 <= 1.0) {
        fVar17 = fVar13;
      }
      fVar17 = (float)(~-(uint)(fVar13 < 0.0) & (uint)fVar17);
      goto LAB_00145828;
    }
    bVar5 = false;
    goto LAB_00145b79;
  }
  if (pIVar1->ActiveIdSource != ImGuiInputSource_Mouse) goto LAB_00145b76;
  if ((pIVar1->IO).MouseDown[0] == false) {
    ClearActiveID();
    bVar5 = false;
    goto LAB_00145b79;
  }
  pfVar3 = ImVec2::operator[](&(pIVar1->IO).MousePos,idx);
  fVar17 = 0.0;
  if (0.0 < fVar16 - fVar8) {
    fVar12 = (*pfVar3 - fVar15) / (fVar16 - fVar8);
    fVar17 = 1.0;
    if (fVar12 <= 1.0) {
      fVar17 = fVar12;
    }
    fVar17 = (float)(~-(uint)(fVar12 < 0.0) & (uint)fVar17);
  }
  if (idx != 0) {
    fVar17 = 1.0 - fVar17;
  }
LAB_00145828:
  if (bVar5 && bVar6) {
    if (fVar11 <= fVar17) {
      uVar4 = -(uint)(1e-06 < ABS(fVar11 + -1.0));
      fVar9 = powf((float)(~uVar4 & (uint)fVar17 |
                          (uint)((fVar17 - fVar11) / (1.0 - fVar11)) & uVar4),power);
      fVar12 = (float)(-(uint)(0.0 <= v_min) & (uint)v_min);
      fVar17 = (v_max - fVar12) * fVar9;
      goto LAB_00145abd;
    }
    fVar9 = powf(1.0 - fVar17 / fVar11,power);
    fVar17 = v_max;
    if (0.0 <= v_max) {
      fVar17 = 0.0;
    }
    fVar17 = (v_min - fVar17) * fVar9 + fVar17;
  }
  else {
    fVar12 = v_min;
    if (uVar4 == 8) {
      fVar17 = fVar9 * fVar17;
    }
    else {
      fVar9 = fVar9 * fVar17;
      fVar17 = fVar9 + 0.5;
      if (fVar9 + 0.5 <= fVar9) {
        fVar17 = fVar9;
      }
    }
LAB_00145abd:
    fVar17 = fVar17 + fVar12;
  }
  fVar9 = RoundScalarWithFormatT<float,float>(format,data_type,fVar17);
  if ((*v != fVar9) || (NAN(*v) || NAN(fVar9))) {
    *v = fVar9;
    bVar5 = true;
  }
  else {
    bVar5 = false;
  }
LAB_00145b79:
  if (1.0 <= fVar16) {
    fVar9 = SliderCalcRatioFromValueT<float,float>(data_type,*v,v_min,v_max,power,fVar11);
    if (idx != 0) {
      fVar9 = 1.0 - fVar9;
    }
    fVar15 = (((fVar10 + -2.0) - fVar8 * 0.5) - fVar15) * fVar9 + fVar15;
    if (idx == 0) {
      fVar9 = (bb->Min).y;
      fVar16 = (bb->Max).y;
      (out_grab_bb->Min).x = -fVar8 * 0.5 + fVar15;
      (out_grab_bb->Min).y = fVar9 + 2.0;
      (out_grab_bb->Max).x = fVar8 * 0.5 + fVar15;
      (out_grab_bb->Max).y = fVar16 + -2.0;
    }
    else {
      fVar9 = (bb->Max).x;
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = -fVar8 * 0.5 + fVar15;
      (out_grab_bb->Max).x = fVar9 + -2.0;
      (out_grab_bb->Max).y = fVar8 * 0.5 + fVar15;
    }
  }
  else {
    IVar14 = bb->Min;
    out_grab_bb->Min = IVar14;
    out_grab_bb->Max = IVar14;
  }
  return bVar5;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f / power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f / power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (!is_decimal && v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = SliderCalcRatioFromValueT<TYPE, FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}